

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O2

uint64_t nn_get_statistic(int s,int statistic)

{
  int iVar1;
  nn_sock *in_RAX;
  int *piVar2;
  uint64_t uStack_20;
  nn_sock *sock;
  
  sock = in_RAX;
  iVar1 = nn_global_hold_socket(&sock,s);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    *piVar2 = -iVar1;
    uStack_20 = 0xffffffffffffffff;
  }
  else {
    switch(statistic) {
    case 0x65:
      uStack_20 = (sock->statistics).established_connections;
      break;
    case 0x66:
      uStack_20 = (sock->statistics).accepted_connections;
      break;
    case 0x67:
      uStack_20 = (sock->statistics).dropped_connections;
      break;
    case 0x68:
      uStack_20 = (sock->statistics).broken_connections;
      break;
    case 0x69:
      uStack_20 = (sock->statistics).connect_errors;
      break;
    case 0x6a:
    case 0x6b:
      uStack_20 = (sock->statistics).bind_errors;
      break;
    default:
      switch(statistic) {
      case 0x12d:
        uStack_20 = (sock->statistics).messages_sent;
        break;
      case 0x12e:
        uStack_20 = (sock->statistics).messages_received;
        break;
      case 0x12f:
        uStack_20 = (sock->statistics).bytes_sent;
        break;
      case 0x130:
        uStack_20 = (sock->statistics).bytes_received;
        break;
      default:
        if (statistic == 0xc9) {
          uStack_20 = (uint64_t)(sock->statistics).current_connections;
        }
        else if (statistic == 0xca) {
          uStack_20 = (uint64_t)(sock->statistics).inprogress_connections;
        }
        else if (statistic == 0xcb) {
          uStack_20 = (uint64_t)(sock->statistics).current_ep_errors;
        }
        else if (statistic == 0x191) {
          uStack_20 = (uint64_t)(sock->statistics).current_snd_priority;
        }
        else {
          piVar2 = __errno_location();
          *piVar2 = 0x16;
          uStack_20 = 0xffffffffffffffff;
        }
      }
    }
    nn_global_rele_socket(sock);
  }
  return uStack_20;
}

Assistant:

uint64_t nn_get_statistic (int s, int statistic)
{
    int rc;
    struct nn_sock *sock;
    uint64_t val;

    rc = nn_global_hold_socket (&sock, s);
    if (nn_slow (rc < 0)) {
        errno = -rc;
        return (uint64_t)-1;
    }

    switch (statistic) {
    case NN_STAT_ESTABLISHED_CONNECTIONS:
        val = sock->statistics.established_connections;
        break;
    case NN_STAT_ACCEPTED_CONNECTIONS:
        val = sock->statistics.accepted_connections;
        break;
    case NN_STAT_DROPPED_CONNECTIONS:
        val = sock->statistics.dropped_connections;
        break;
    case NN_STAT_BROKEN_CONNECTIONS:
        val = sock->statistics.broken_connections;
        break;
    case NN_STAT_CONNECT_ERRORS:
        val = sock->statistics.connect_errors;
        break;
    case NN_STAT_BIND_ERRORS:
        val = sock->statistics.bind_errors;
        break;
    case NN_STAT_ACCEPT_ERRORS:
        val = sock->statistics.bind_errors;
        break;
    case NN_STAT_MESSAGES_SENT:
        val = sock->statistics.messages_sent;
        break;
    case NN_STAT_MESSAGES_RECEIVED:
        val = sock->statistics.messages_received;
        break;
    case NN_STAT_BYTES_SENT:
        val = sock->statistics.bytes_sent;
        break;
    case NN_STAT_BYTES_RECEIVED:
        val = sock->statistics.bytes_received;
        break;
    case NN_STAT_CURRENT_CONNECTIONS:
        val = sock->statistics.current_connections;
        break;
    case NN_STAT_INPROGRESS_CONNECTIONS:
        val = sock->statistics.inprogress_connections;
        break;
    case NN_STAT_CURRENT_SND_PRIORITY:
        val = sock->statistics.current_snd_priority;
        break;
    case NN_STAT_CURRENT_EP_ERRORS:
        val = sock->statistics.current_ep_errors;
        break;
    default:
        val = (uint64_t)-1;
        errno = EINVAL;
        break;
    }

    nn_global_rele_socket (sock);
    return val;
}